

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O3

int KINBBDPrecGetNumGfnEvals(void *kinmem,long *ngevalsBBDP)

{
  long lVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL Memory is NULL.";
    iVar2 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
  }
  else if (*(long *)((long)kinmem + 0x1f8) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar2 = -2;
    error_code = -2;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)kinmem + 0x1f8) + 0x90);
    if (lVar1 != 0) {
      *ngevalsBBDP = *(long *)(lVar1 + 0x88);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. IDABBDPrecInit must be called.";
    iVar2 = -5;
    error_code = -5;
  }
  KINProcessError((KINMem)kinmem,error_code,"KINBBDPRE","KINBBDPrecGetNumGfnEvals",msgfmt);
  return iVar2;
}

Assistant:

int KINBBDPrecGetNumGfnEvals(void *kinmem,
                             long int *ngevalsBBDP)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;

  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINBBDPRE",
                    "KINBBDPrecGetNumGfnEvals", MSGBBD_MEM_NULL);
    return(KINLS_MEM_NULL);
  }
  kin_mem = (KINMem) kinmem;

  if (kin_mem->kin_lmem == NULL) {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, "KINBBDPRE",
                    "KINBBDPrecGetNumGfnEvals", MSGBBD_LMEM_NULL);
    return(KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem) kin_mem->kin_lmem;

  if (kinls_mem->pdata == NULL) {
    KINProcessError(kin_mem, KINLS_PMEM_NULL, "KINBBDPRE",
                    "KINBBDPrecGetNumGfnEvals", MSGBBD_PMEM_NULL);
    return(KINLS_PMEM_NULL);
  } 
  pdata = (KBBDPrecData) kinls_mem->pdata;

  *ngevalsBBDP = pdata->nge;

  return(KINLS_SUCCESS);
}